

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestMembraneImpl::makeThing
          (TestMembraneImpl *this,MakeThingContext context)

{
  undefined1 local_a0 [64];
  Maybe<capnp::MessageSize> local_60;
  Builder local_48;
  Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_&> local_20;
  TestMembraneImpl *this_local;
  MakeThingContext context_local;
  
  local_20.ptr = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)context.hook;
  context_local.hook = (CallContextHook *)this;
  kj::Maybe<capnp::MessageSize>::Maybe();
  CallContext<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  ::getResults(&local_48,
               (CallContext<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
                *)&this_local,&local_60);
  kj::heap<capnp::_::(anonymous_namespace)::ThingImpl,char_const(&)[7]>
            ((kj *)local_a0,(char (*) [7])"inside");
  capnproto_test::capnp::test::TestMembrane::Thing::Client::
  Client<capnp::_::(anonymous_namespace)::ThingImpl,void>
            ((Client *)(local_a0 + 0x10),
             (Own<capnp::_::(anonymous_namespace)::ThingImpl,_std::nullptr_t> *)local_a0);
  capnproto_test::capnp::test::TestMembrane::MakeThingResults::Builder::setThing
            (&local_48,(Client *)(local_a0 + 0x10));
  capnproto_test::capnp::test::TestMembrane::Thing::Client::~Client((Client *)(local_a0 + 0x10));
  kj::Own<capnp::_::(anonymous_namespace)::ThingImpl,_std::nullptr_t>::~Own
            ((Own<capnp::_::(anonymous_namespace)::ThingImpl,_std::nullptr_t> *)local_a0);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_60);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> makeThing(MakeThingContext context) override {
    context.getResults().setThing(kj::heap<ThingImpl>("inside"));
    return kj::READY_NOW;
  }